

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::getStandardFormLp
          (Highs *this,HighsInt *num_col,HighsInt *num_row,HighsInt *num_nz,double *offset,
          double *cost,double *rhs,HighsInt *start,HighsInt *index,double *value)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  if ((this->written_log_header_ == false) &&
     (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true)) {
    highsLogHeader(&(this->options_).super_HighsOptionsStruct.log_options,
                   (this->options_).super_HighsOptionsStruct.log_githash);
    this->written_log_header_ = true;
  }
  if (this->standard_form_valid_ == false) {
    formStandardFormLp(this);
  }
  pdVar1 = (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *num_col = (HighsInt)
             ((ulong)((long)(this->standard_form_cost_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
  pdVar2 = (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *num_row = (HighsInt)
             ((ulong)((long)(this->standard_form_rhs_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  piVar3 = (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *num_nz = piVar3[*num_col];
  *offset = this->standard_form_offset_;
  iVar7 = *num_col;
  if (0 < iVar7) {
    lVar6 = 0;
    do {
      if (cost != (double *)0x0) {
        cost[lVar6] = pdVar1[lVar6];
      }
      if (start != (HighsInt *)0x0) {
        start[lVar6] = piVar3[lVar6];
      }
      if ((index != (HighsInt *)0x0 || value != (double *)0x0) &&
         (lVar8 = (long)piVar3[lVar6], piVar3[lVar6] < piVar3[lVar6 + 1])) {
        piVar4 = (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (this->standard_form_matrix_).value_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        do {
          if (index != (HighsInt *)0x0) {
            index[lVar8] = piVar4[lVar8];
          }
          if (value != (double *)0x0) {
            value[lVar8] = pdVar5[lVar8];
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < piVar3[lVar6 + 1]);
      }
      lVar6 = lVar6 + 1;
      iVar7 = *num_col;
    } while (lVar6 < iVar7);
  }
  if (start != (HighsInt *)0x0) {
    start[iVar7] = piVar3[iVar7];
  }
  if ((rhs != (double *)0x0) && (iVar7 = *num_row, 0 < (long)iVar7)) {
    lVar6 = 0;
    do {
      rhs[lVar6] = pdVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar7 != lVar6);
  }
  return kOk;
}

Assistant:

HighsStatus Highs::getStandardFormLp(HighsInt& num_col, HighsInt& num_row,
                                     HighsInt& num_nz, double& offset,
                                     double* cost, double* rhs, HighsInt* start,
                                     HighsInt* index, double* value) {
  this->logHeader();
  if (!this->standard_form_valid_) {
    HighsStatus status = formStandardFormLp();
    assert(status == HighsStatus::kOk);
  }
  num_col = this->standard_form_cost_.size();
  num_row = this->standard_form_rhs_.size();
  num_nz = this->standard_form_matrix_.start_[num_col];
  offset = this->standard_form_offset_;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (cost) cost[iCol] = this->standard_form_cost_[iCol];
    if (start) start[iCol] = this->standard_form_matrix_.start_[iCol];
    if (index || value) {
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        if (index) index[iEl] = this->standard_form_matrix_.index_[iEl];
        if (value) value[iEl] = this->standard_form_matrix_.value_[iEl];
      }
    }
  }
  if (start) start[num_col] = this->standard_form_matrix_.start_[num_col];
  if (rhs) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++)
      rhs[iRow] = this->standard_form_rhs_[iRow];
  }
  return HighsStatus::kOk;
}